

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  pointer pcVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  string targetName;
  long *local_58;
  long local_50;
  long local_48 [2];
  string local_38;
  
  pcVar1 = (this->Namespace)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->Namespace)._M_string_length);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_38,target);
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Create imported target ",0x19);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  TVar3 = cmGeneratorTarget::GetType(target);
  switch(TVar3) {
  case EXECUTABLE:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_executable(",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0xb;
    pcVar6 = " IMPORTED)\n";
    break;
  case STATIC_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0x12;
    pcVar6 = " STATIC IMPORTED)\n";
    break;
  case SHARED_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0x12;
    pcVar6 = " SHARED IMPORTED)\n";
    break;
  case MODULE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0x12;
    pcVar6 = " MODULE IMPORTED)\n";
    break;
  case OBJECT_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0x12;
    pcVar6 = " OBJECT IMPORTED)\n";
    break;
  default:
    goto switchD_003c991f_caseD_5;
  case INTERFACE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0x15;
    pcVar6 = " INTERFACE IMPORTED)\n";
    break;
  case UNKNOWN_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    lVar5 = 0x13;
    pcVar6 = " UNKNOWN IMPORTED)\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
switchD_003c991f_caseD_5:
  bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY ENABLE_EXPORTS 1)\n",0x1c);
  }
  bVar2 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY FRAMEWORK 1)\n",0x17);
  }
  bVar2 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY MACOSX_BUNDLE 1)\n",0x1b);
  }
  bVar2 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY BUNDLE 1)\n",0x14);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }
  os << "\n";
}